

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O2

void __thiscall SQCompilation::Block::addStatement(Block *this,Statement *stmt)

{
  Statement *local_8;
  
  local_8 = stmt;
  ArenaVector<SQCompilation::Statement_*>::push_back(&this->_statements,&local_8);
  return;
}

Assistant:

void addStatement(Statement *stmt) { assert(stmt); _statements.push_back(stmt); }